

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

iterator __thiscall
ImplicitDepLoader::PreallocateSpace(ImplicitDepLoader *this,Edge *edge,int count)

{
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> _Var1;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_60;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_58;
  Node **local_50;
  value_type local_48;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_40;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> local_38;
  const_iterator local_30;
  int local_24;
  Edge *pEStack_20;
  int count_local;
  Edge *edge_local;
  ImplicitDepLoader *this_local;
  
  local_24 = count;
  pEStack_20 = edge;
  edge_local = (Edge *)this;
  local_40._M_current = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&edge->inputs_);
  local_38 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
             operator-(&local_40,(long)pEStack_20->order_only_deps_);
  __gnu_cxx::__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>>::
  __normal_iterator<Node**>
            ((__normal_iterator<Node*const*,std::vector<Node*,std::allocator<Node*>>> *)&local_30,
             &local_38);
  local_48 = (value_type)0x0;
  local_50 = (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::insert
                                (&edge->inputs_,local_30,(long)local_24,&local_48);
  pEStack_20->implicit_deps_ = local_24 + pEStack_20->implicit_deps_;
  local_60._M_current =
       (Node **)std::vector<Node_*,_std::allocator<Node_*>_>::end(&pEStack_20->inputs_);
  local_58 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
             operator-(&local_60,(long)pEStack_20->order_only_deps_);
  _Var1 = __gnu_cxx::__normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_>::
          operator-(&local_58,(long)local_24);
  return (iterator)_Var1._M_current;
}

Assistant:

vector<Node*>::iterator ImplicitDepLoader::PreallocateSpace(Edge* edge,
                                                            int count) {
  edge->inputs_.insert(edge->inputs_.end() - edge->order_only_deps_,
                       (size_t)count, 0);
  edge->implicit_deps_ += count;
  return edge->inputs_.end() - edge->order_only_deps_ - count;
}